

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * cimg_library::CImg<unsigned_char>::default_LUT256(void)

{
  uint index;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  if (default_LUT256()::colormap == '\0') {
    default_LUT256();
  }
  if (cimg::Mutex_attr()::val == '\0') {
    default_LUT256();
  }
  pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x140));
  if (default_LUT256::colormap._data == (uchar *)0x0) {
    assign(&default_LUT256::colormap,1,0x100,1,3);
    uVar1 = 0;
    uVar2 = 0x10;
    do {
      uVar3 = 0x10;
      do {
        iVar4 = -0x100;
        do {
          uVar5 = (ulong)uVar1;
          default_LUT256::colormap._data[default_LUT256::colormap._width * uVar5] = (uchar)uVar2;
          default_LUT256::colormap._data
          [(ulong)default_LUT256::colormap._height * (ulong)default_LUT256::colormap._width +
           default_LUT256::colormap._width * uVar5] = (uchar)uVar3;
          uVar1 = uVar1 + 1;
          default_LUT256::colormap._data
          [(ulong)default_LUT256::colormap._height * (ulong)default_LUT256::colormap._width * 2 +
           uVar5 * default_LUT256::colormap._width] = (char)iVar4 + ' ';
          iVar4 = iVar4 + 0x40;
        } while (iVar4 != 0);
        bVar6 = uVar3 < 0xe0;
        uVar3 = uVar3 + 0x20;
      } while (bVar6);
      bVar6 = uVar2 < 0xe0;
      uVar2 = uVar2 + 0x20;
    } while (bVar6);
  }
  if (cimg::Mutex_attr()::val == '\0') {
    default_LUT256();
  }
  pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x140));
  return &default_LUT256::colormap;
}

Assistant:

static const CImg<Tuchar>& default_LUT256() {
      static CImg<Tuchar> colormap;
      cimg::mutex(8);
      if (!colormap) {
        colormap.assign(1,256,1,3);
        for (unsigned int index = 0, r = 16; r<256; r+=32)
          for (unsigned int g = 16; g<256; g+=32)
            for (unsigned int b = 32; b<256; b+=64) {
              colormap(0,index,0) = (Tuchar)r;
              colormap(0,index,1) = (Tuchar)g;
              colormap(0,index++,2) = (Tuchar)b;
            }
      }
      cimg::mutex(8,0);
      return colormap;
    }